

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void option_toggle_display
               (menu_conflict *m,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  uint8_t attr_00;
  void *pvVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *desc_copy;
  size_t u8len;
  char *desc;
  _Bool *options;
  uint8_t attr;
  wchar_t width_local;
  wchar_t col_local;
  wchar_t row_local;
  _Bool cursor_local;
  wchar_t oid_local;
  menu_conflict *m_local;
  
  attr_00 = curs_attrs[1][(int)(uint)cursor];
  pvVar1 = menu_priv(m);
  pcVar2 = option_desc(oid);
  sVar3 = utf8_strlen(pcVar2);
  if (sVar3 < 0x2d) {
    pcVar2 = format("%s%*s",pcVar2,(ulong)(0x2d - (int)sVar3)," ");
    c_prt(attr_00,pcVar2,row,col);
  }
  else {
    pcVar2 = string_make(pcVar2);
    if (0x2d < sVar3) {
      utf8_clipto(pcVar2,0x2d);
    }
    c_prt(attr_00,pcVar2,row,col);
    string_free(pcVar2);
  }
  pcVar2 = "no ";
  if ((*(byte *)((long)pvVar1 + (long)oid) & 1) != 0) {
    pcVar2 = "yes";
  }
  pcVar4 = option_name(oid);
  pcVar2 = format(": %s  (%s)",pcVar2,pcVar4);
  c_prt(attr_00,pcVar2,row,col + L'-');
  return;
}

Assistant:

static void option_toggle_display(struct menu *m, int oid, bool cursor,
		int row, int col, int width)
{
	uint8_t attr = curs_attrs[CURS_KNOWN][cursor != 0];
	bool *options = menu_priv(m);
	const char *desc = option_desc(oid);
	size_t u8len = utf8_strlen(desc);

	if (u8len < 45) {
		c_prt(attr, format("%s%*s", desc, (int)(45 - u8len), " "), row,
			col);
	} else {
		char *desc_copy = string_make(desc);

		if (u8len > 45) {
			utf8_clipto(desc_copy, 45);
		}
		c_prt(attr, desc_copy, row, col);
		string_free(desc_copy);
	}
	c_prt(attr, format(": %s  (%s)", options[oid] ? "yes" : "no ",
		option_name(oid)), row, col + 45);
}